

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>::
     Operation<short,duckdb::string_t,duckdb::ArgMinMaxState<short,duckdb::string_t>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
               (ArgMinMaxState<short,_duckdb::string_t> *state,short *x,string_t *y,
               AggregateBinaryInput *binary)

{
  string_t y_data;
  bool bVar1;
  ArgMinMaxState<short,_duckdb::string_t> *in_RCX;
  TemplatedValidityMask<unsigned_long> *in_RDX;
  idx_t in_RSI;
  byte *in_RDI;
  AggregateBinaryInput *in_stack_ffffffffffffffc0;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffc8;
  string_t *in_stack_ffffffffffffffd0;
  short *in_stack_ffffffffffffffd8;
  
  if ((*in_RDI & 1) == 0) {
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (in_stack_ffffffffffffffc8,(idx_t)in_stack_ffffffffffffffc0);
    if (bVar1) {
      TemplatedValidityMask<unsigned_long>::RowIsValid(in_RDX,in_RSI);
      Assign<short,duckdb::string_t,duckdb::ArgMinMaxState<short,duckdb::string_t>>
                (in_RCX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                 SUB81((ulong)in_RDX >> 0x38,0));
      *in_RDI = 1;
    }
  }
  else {
    y_data.value.pointer.ptr = (char *)in_RCX;
    y_data.value._0_8_ =
         (in_RDX->validity_data).internal.
         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    Execute<short,duckdb::string_t,duckdb::ArgMinMaxState<short,duckdb::string_t>>
              ((ArgMinMaxState<short,_duckdb::string_t> *)in_RDX->validity_mask,
               (short)((ulong)in_stack_ffffffffffffffc8 >> 0x30),y_data,in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}